

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O2

void dctForward8x8(float *data)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  int iter;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  
  for (iter = 0; iter != 2; iter = iter + 1) {
    for (lVar9 = 0xe0; lVar9 != 0x100; lVar9 = lVar9 + 0x10) {
      pfVar1 = (float *)((long)data + lVar9);
      pfVar6 = (float *)((long)data + lVar9 + -0xe0);
      pfVar7 = (float *)((long)data + lVar9 + -0xc0);
      pfVar8 = (float *)((long)data + lVar9 + -0xa0);
      pfVar2 = (float *)((long)data + lVar9 + -0x80);
      fVar42 = *pfVar6 + *pfVar1;
      fVar43 = pfVar6[1] + pfVar1[1];
      fVar44 = pfVar6[2] + pfVar1[2];
      fVar45 = pfVar6[3] + pfVar1[3];
      fVar22 = *pfVar7 + *pfVar8;
      fVar23 = pfVar7[1] + pfVar8[1];
      fVar24 = pfVar7[2] + pfVar8[2];
      fVar25 = pfVar7[3] + pfVar8[3];
      pfVar3 = (float *)((long)data + lVar9 + -0x60);
      fVar34 = *pfVar2 + *pfVar3;
      fVar35 = pfVar2[1] + pfVar3[1];
      fVar36 = pfVar2[2] + pfVar3[2];
      fVar37 = pfVar2[3] + pfVar3[3];
      pfVar4 = (float *)((long)data + lVar9 + -0x40);
      pfVar5 = (float *)((long)data + lVar9 + -0x20);
      fVar30 = *pfVar6 - *pfVar1;
      fVar31 = pfVar6[1] - pfVar1[1];
      fVar32 = pfVar6[2] - pfVar1[2];
      fVar33 = pfVar6[3] - pfVar1[3];
      fVar46 = *pfVar4 + *pfVar5;
      fVar47 = pfVar4[1] + pfVar5[1];
      fVar48 = pfVar4[2] + pfVar5[2];
      fVar49 = pfVar4[3] + pfVar5[3];
      fVar38 = *pfVar7 - *pfVar8;
      fVar39 = pfVar7[1] - pfVar8[1];
      fVar40 = pfVar7[2] - pfVar8[2];
      fVar41 = pfVar7[3] - pfVar8[3];
      fVar18 = *pfVar2 - *pfVar3;
      fVar19 = pfVar2[1] - pfVar3[1];
      fVar20 = pfVar2[2] - pfVar3[2];
      fVar21 = pfVar2[3] - pfVar3[3];
      fVar26 = *pfVar4 - *pfVar5;
      fVar27 = pfVar4[1] - pfVar5[1];
      fVar28 = pfVar4[2] - pfVar5[2];
      fVar29 = pfVar4[3] - pfVar5[3];
      fVar10 = (fVar42 + fVar34) * 0.70710677;
      fVar11 = (fVar43 + fVar35) * 0.70710677;
      fVar12 = (fVar44 + fVar36) * 0.70710677;
      fVar13 = (fVar45 + fVar37) * 0.70710677;
      fVar14 = (fVar22 + fVar46) * 0.70710677;
      fVar15 = (fVar23 + fVar47) * 0.70710677;
      fVar16 = (fVar24 + fVar48) * 0.70710677;
      fVar17 = (fVar25 + fVar49) * 0.70710677;
      pfVar1 = (float *)((long)data + lVar9 + -0xe0);
      *pfVar1 = (fVar10 + fVar14) * 0.5;
      pfVar1[1] = (fVar11 + fVar15) * 0.5;
      pfVar1[2] = (fVar12 + fVar16) * 0.5;
      pfVar1[3] = (fVar13 + fVar17) * 0.5;
      pfVar1 = (float *)((long)data + lVar9 + -0x60);
      *pfVar1 = (fVar10 - fVar14) * 0.5;
      pfVar1[1] = (fVar11 - fVar15) * 0.5;
      pfVar1[2] = (fVar12 - fVar16) * 0.5;
      pfVar1[3] = (fVar13 - fVar17) * 0.5;
      fVar10 = fVar38 - fVar26;
      fVar11 = fVar39 - fVar27;
      fVar12 = fVar40 - fVar28;
      fVar13 = fVar41 - fVar29;
      fVar42 = fVar42 - fVar34;
      fVar43 = fVar43 - fVar35;
      fVar44 = fVar44 - fVar36;
      fVar45 = fVar45 - fVar37;
      pfVar1 = (float *)((long)data + lVar9 + -0xa0);
      *pfVar1 = fVar42 * 0.46193978 + fVar10 * 0.19134171;
      pfVar1[1] = fVar43 * 0.46193978 + fVar11 * 0.19134171;
      pfVar1[2] = fVar44 * 0.46193978 + fVar12 * 0.19134171;
      pfVar1[3] = fVar45 * 0.46193978 + fVar13 * 0.19134171;
      pfVar1 = (float *)((long)data + lVar9 + -0x20);
      *pfVar1 = fVar42 * 0.19134171 - fVar10 * 0.46193978;
      pfVar1[1] = fVar43 * 0.19134171 - fVar11 * 0.46193978;
      pfVar1[2] = fVar44 * 0.19134171 - fVar12 * 0.46193978;
      pfVar1[3] = fVar45 * 0.19134171 - fVar13 * 0.46193978;
      fVar22 = (fVar22 - fVar46) * 0.70710677;
      fVar23 = (fVar23 - fVar47) * 0.70710677;
      fVar24 = (fVar24 - fVar48) * 0.70710677;
      fVar25 = (fVar25 - fVar49) * 0.70710677;
      fVar26 = (fVar26 + fVar38) * -0.70710677;
      fVar27 = (fVar27 + fVar39) * -0.70710677;
      fVar28 = (fVar28 + fVar40) * -0.70710677;
      fVar29 = (fVar29 + fVar41) * -0.70710677;
      fVar10 = fVar30 - fVar22;
      fVar11 = fVar31 - fVar23;
      fVar12 = fVar32 - fVar24;
      fVar13 = fVar33 - fVar25;
      fVar14 = fVar18 + fVar26;
      fVar15 = fVar19 + fVar27;
      fVar16 = fVar20 + fVar28;
      fVar17 = fVar21 + fVar29;
      pfVar1 = (float *)((long)data + lVar9 + -0x80);
      *pfVar1 = fVar10 * 0.4157348 - fVar14 * 0.27778512;
      pfVar1[1] = fVar11 * 0.4157348 - fVar15 * 0.27778512;
      pfVar1[2] = fVar12 * 0.4157348 - fVar16 * 0.27778512;
      pfVar1[3] = fVar13 * 0.4157348 - fVar17 * 0.27778512;
      pfVar1 = (float *)((long)data + lVar9 + -0x40);
      *pfVar1 = fVar14 * 0.4157348 + fVar10 * 0.27778512;
      pfVar1[1] = fVar15 * 0.4157348 + fVar11 * 0.27778512;
      pfVar1[2] = fVar16 * 0.4157348 + fVar12 * 0.27778512;
      pfVar1[3] = fVar17 * 0.4157348 + fVar13 * 0.27778512;
      fVar22 = fVar22 + fVar30;
      fVar23 = fVar23 + fVar31;
      fVar24 = fVar24 + fVar32;
      fVar25 = fVar25 + fVar33;
      fVar26 = fVar26 - fVar18;
      fVar27 = fVar27 - fVar19;
      fVar28 = fVar28 - fVar20;
      fVar29 = fVar29 - fVar21;
      pfVar1 = (float *)((long)data + lVar9 + -0xc0);
      *pfVar1 = fVar22 * 0.49039263 - fVar26 * 0.09754516;
      pfVar1[1] = fVar23 * 0.49039263 - fVar27 * 0.09754516;
      pfVar1[2] = fVar24 * 0.49039263 - fVar28 * 0.09754516;
      pfVar1[3] = fVar25 * 0.49039263 - fVar29 * 0.09754516;
      pfVar1 = (float *)((long)data + lVar9);
      *pfVar1 = fVar26 * 0.49039263 + fVar22 * 0.09754516;
      pfVar1[1] = fVar27 * 0.49039263 + fVar23 * 0.09754516;
      pfVar1[2] = fVar28 * 0.49039263 + fVar24 * 0.09754516;
      pfVar1[3] = fVar29 * 0.49039263 + fVar25 * 0.09754516;
    }
    fVar10 = data[1];
    fVar11 = data[2];
    fVar12 = data[3];
    fVar13 = data[0xb];
    fVar14 = data[0x11];
    fVar15 = data[0x13];
    fVar16 = data[0x25];
    fVar17 = data[0x26];
    fVar18 = data[0x27];
    fVar19 = data[0x2f];
    fVar20 = data[0x35];
    fVar21 = data[0x37];
    *data = *data;
    data[1] = data[8];
    data[2] = data[0x10];
    data[3] = data[0x18];
    data[0x10] = fVar11;
    data[0x11] = data[10];
    data[0x12] = data[0x12];
    data[0x13] = data[0x1a];
    data[8] = fVar10;
    data[9] = data[9];
    data[10] = fVar14;
    data[0xb] = data[0x19];
    data[0x18] = fVar12;
    data[0x19] = fVar13;
    data[0x1a] = fVar15;
    data[0x1b] = data[0x1b];
    data[0x24] = data[0x24];
    data[0x25] = data[0x2c];
    data[0x26] = data[0x34];
    data[0x27] = data[0x3c];
    data[0x34] = fVar17;
    data[0x35] = data[0x2e];
    data[0x36] = data[0x36];
    data[0x37] = data[0x3e];
    data[0x2c] = fVar16;
    data[0x2d] = data[0x2d];
    data[0x2e] = fVar20;
    data[0x2f] = data[0x3d];
    data[0x3c] = fVar18;
    data[0x3d] = fVar19;
    data[0x3e] = fVar21;
    data[0x3f] = data[0x3f];
    fVar10 = data[0x20];
    fVar11 = data[0x21];
    fVar12 = data[0x22];
    fVar13 = data[0x23];
    fVar14 = data[0x28];
    fVar15 = data[0x29];
    fVar16 = data[0x2a];
    fVar17 = data[0x2b];
    fVar18 = data[0x30];
    fVar19 = data[0x31];
    fVar20 = data[0x32];
    fVar21 = data[0x33];
    fVar22 = data[0x38];
    fVar23 = data[0x39];
    fVar24 = data[0x3a];
    fVar25 = data[0x3b];
    data[0x20] = data[4];
    data[0x21] = data[0xc];
    data[0x22] = data[0x14];
    data[0x23] = data[0x1c];
    data[0x30] = data[6];
    data[0x31] = data[0xe];
    data[0x32] = data[0x16];
    data[0x33] = data[0x1e];
    data[0x28] = data[5];
    data[0x29] = data[0xd];
    data[0x2a] = data[0x15];
    data[0x2b] = data[0x1d];
    data[0x38] = data[7];
    data[0x39] = data[0xf];
    data[0x3a] = data[0x17];
    data[0x3b] = data[0x1f];
    data[4] = fVar10;
    data[5] = fVar14;
    data[6] = fVar18;
    data[7] = fVar22;
    data[0x14] = fVar12;
    data[0x15] = fVar16;
    data[0x16] = fVar20;
    data[0x17] = fVar24;
    data[0xc] = fVar11;
    data[0xd] = fVar15;
    data[0xe] = fVar19;
    data[0xf] = fVar23;
    data[0x1c] = fVar13;
    data[0x1d] = fVar17;
    data[0x1e] = fVar21;
    data[0x1f] = fVar25;
  }
  return;
}

Assistant:

void
dctForward8x8 (float* data)
{
    __m128* srcVec = (__m128*) data;
    __m128  a0Vec, a1Vec, a2Vec, a3Vec, a4Vec, a5Vec, a6Vec, a7Vec;
    __m128  k0Vec, k1Vec, rotXVec, rotYVec;
    __m128  transTmp[4], transTmp2[4];

    __m128 c4Vec    = {.70710678f, .70710678f, .70710678f, .70710678f};
    __m128 c4NegVec = {-.70710678f, -.70710678f, -.70710678f, -.70710678f};

    __m128 c1HalfVec = {.490392640f, .490392640f, .490392640f, .490392640f};
    __m128 c2HalfVec = {.461939770f, .461939770f, .461939770f, .461939770f};
    __m128 c3HalfVec = {.415734810f, .415734810f, .415734810f, .415734810f};
    __m128 c5HalfVec = {.277785120f, .277785120f, .277785120f, .277785120f};
    __m128 c6HalfVec = {.191341720f, .191341720f, .191341720f, .191341720f};
    __m128 c7HalfVec = {.097545161f, .097545161f, .097545161f, .097545161f};

    __m128 halfVec = {.5f, .5f, .5f, .5f};

    for (int iter = 0; iter < 2; ++iter)
    {
        //
        //  Operate on 4 columns at a time. The
        //    offsets into our row-major array are:
        //                  0:  0      1
        //                  1:  2      3
        //                  2:  4      5
        //                  3:  6      7
        //                  4:  8      9
        //                  5: 10     11
        //                  6: 12     13
        //                  7: 14     15
        //

        for (int pass = 0; pass < 2; ++pass)
        {
            a0Vec = _mm_add_ps (srcVec[0 + pass], srcVec[14 + pass]);
            a1Vec = _mm_add_ps (srcVec[2 + pass], srcVec[4 + pass]);
            a3Vec = _mm_add_ps (srcVec[6 + pass], srcVec[8 + pass]);
            a5Vec = _mm_add_ps (srcVec[10 + pass], srcVec[12 + pass]);

            a7Vec = _mm_sub_ps (srcVec[0 + pass], srcVec[14 + pass]);
            a2Vec = _mm_sub_ps (srcVec[2 + pass], srcVec[4 + pass]);
            a4Vec = _mm_sub_ps (srcVec[6 + pass], srcVec[8 + pass]);
            a6Vec = _mm_sub_ps (srcVec[10 + pass], srcVec[12 + pass]);

            //
            // First stage; Compute out_0 and out_4
            //

            k0Vec = _mm_add_ps (a0Vec, a3Vec);
            k1Vec = _mm_add_ps (a1Vec, a5Vec);

            k0Vec = _mm_mul_ps (c4Vec, k0Vec);
            k1Vec = _mm_mul_ps (c4Vec, k1Vec);

            srcVec[0 + pass] = _mm_add_ps (k0Vec, k1Vec);
            srcVec[8 + pass] = _mm_sub_ps (k0Vec, k1Vec);

            srcVec[0 + pass] = _mm_mul_ps (srcVec[0 + pass], halfVec);
            srcVec[8 + pass] = _mm_mul_ps (srcVec[8 + pass], halfVec);

            //
            // Second stage; Compute out_2 and out_6
            //

            k0Vec = _mm_sub_ps (a2Vec, a6Vec);
            k1Vec = _mm_sub_ps (a0Vec, a3Vec);

            srcVec[4 + pass] = _mm_add_ps (
                _mm_mul_ps (c6HalfVec, k0Vec), _mm_mul_ps (c2HalfVec, k1Vec));

            srcVec[12 + pass] = _mm_sub_ps (
                _mm_mul_ps (c6HalfVec, k1Vec), _mm_mul_ps (c2HalfVec, k0Vec));

            //
            // Precompute K0 and K1 for the remaining stages
            //

            k0Vec = _mm_mul_ps (_mm_sub_ps (a1Vec, a5Vec), c4Vec);
            k1Vec = _mm_mul_ps (_mm_add_ps (a2Vec, a6Vec), c4NegVec);

            //
            // Third Stage, compute out_3 and out_5
            //

            rotXVec = _mm_sub_ps (a7Vec, k0Vec);
            rotYVec = _mm_add_ps (a4Vec, k1Vec);

            srcVec[6 + pass] = _mm_sub_ps (
                _mm_mul_ps (c3HalfVec, rotXVec),
                _mm_mul_ps (c5HalfVec, rotYVec));

            srcVec[10 + pass] = _mm_add_ps (
                _mm_mul_ps (c5HalfVec, rotXVec),
                _mm_mul_ps (c3HalfVec, rotYVec));

            //
            // Fourth Stage, compute out_1 and out_7
            //

            rotXVec = _mm_add_ps (a7Vec, k0Vec);
            rotYVec = _mm_sub_ps (k1Vec, a4Vec);

            srcVec[2 + pass] = _mm_sub_ps (
                _mm_mul_ps (c1HalfVec, rotXVec),
                _mm_mul_ps (c7HalfVec, rotYVec));

            srcVec[14 + pass] = _mm_add_ps (
                _mm_mul_ps (c7HalfVec, rotXVec),
                _mm_mul_ps (c1HalfVec, rotYVec));
        }

        //
        // Transpose the matrix, in 4x4 blocks. So, if we have our
        // 8x8 matrix divied into 4x4 blocks:
        //
        //         M0 | M1         M0t | M2t
        //        ----+---   -->  -----+------
        //         M2 | M3         M1t | M3t
        //

        //
        // M0t, done in place, the first half.
        //

        transTmp[0] = _mm_shuffle_ps (srcVec[0], srcVec[2], 0x44);
        transTmp[1] = _mm_shuffle_ps (srcVec[4], srcVec[6], 0x44);
        transTmp[3] = _mm_shuffle_ps (srcVec[4], srcVec[6], 0xEE);
        transTmp[2] = _mm_shuffle_ps (srcVec[0], srcVec[2], 0xEE);

        //
        // M3t, also done in place, the first half.
        //

        transTmp2[0] = _mm_shuffle_ps (srcVec[9], srcVec[11], 0x44);
        transTmp2[1] = _mm_shuffle_ps (srcVec[13], srcVec[15], 0x44);
        transTmp2[2] = _mm_shuffle_ps (srcVec[9], srcVec[11], 0xEE);
        transTmp2[3] = _mm_shuffle_ps (srcVec[13], srcVec[15], 0xEE);

        //
        // M0t, the second half.
        //

        srcVec[0] = _mm_shuffle_ps (transTmp[0], transTmp[1], 0x88);
        srcVec[4] = _mm_shuffle_ps (transTmp[2], transTmp[3], 0x88);
        srcVec[2] = _mm_shuffle_ps (transTmp[0], transTmp[1], 0xDD);
        srcVec[6] = _mm_shuffle_ps (transTmp[2], transTmp[3], 0xDD);

        //
        // M3t, the second half.
        //

        srcVec[9]  = _mm_shuffle_ps (transTmp2[0], transTmp2[1], 0x88);
        srcVec[13] = _mm_shuffle_ps (transTmp2[2], transTmp2[3], 0x88);
        srcVec[11] = _mm_shuffle_ps (transTmp2[0], transTmp2[1], 0xDD);
        srcVec[15] = _mm_shuffle_ps (transTmp2[2], transTmp2[3], 0xDD);

        //
        // M1 and M2 need to be done at the same time, because we're
        //  swapping.
        //
        // First, the first half of M1t
        //

        transTmp[0] = _mm_shuffle_ps (srcVec[1], srcVec[3], 0x44);
        transTmp[1] = _mm_shuffle_ps (srcVec[5], srcVec[7], 0x44);
        transTmp[2] = _mm_shuffle_ps (srcVec[1], srcVec[3], 0xEE);
        transTmp[3] = _mm_shuffle_ps (srcVec[5], srcVec[7], 0xEE);

        //
        // And the first half of M2t
        //

        transTmp2[0] = _mm_shuffle_ps (srcVec[8], srcVec[10], 0x44);
        transTmp2[1] = _mm_shuffle_ps (srcVec[12], srcVec[14], 0x44);
        transTmp2[2] = _mm_shuffle_ps (srcVec[8], srcVec[10], 0xEE);
        transTmp2[3] = _mm_shuffle_ps (srcVec[12], srcVec[14], 0xEE);

        //
        // Second half of M1t
        //

        srcVec[8]  = _mm_shuffle_ps (transTmp[0], transTmp[1], 0x88);
        srcVec[12] = _mm_shuffle_ps (transTmp[2], transTmp[3], 0x88);
        srcVec[10] = _mm_shuffle_ps (transTmp[0], transTmp[1], 0xDD);
        srcVec[14] = _mm_shuffle_ps (transTmp[2], transTmp[3], 0xDD);

        //
        // Second half of M2
        //

        srcVec[1] = _mm_shuffle_ps (transTmp2[0], transTmp2[1], 0x88);
        srcVec[5] = _mm_shuffle_ps (transTmp2[2], transTmp2[3], 0x88);
        srcVec[3] = _mm_shuffle_ps (transTmp2[0], transTmp2[1], 0xDD);
        srcVec[7] = _mm_shuffle_ps (transTmp2[2], transTmp2[3], 0xDD);
    }
}